

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Admin.h
# Opt level: O0

void __thiscall Admin::resizePersons(Admin *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Person *pPVar4;
  Person *local_48;
  int local_28;
  int i;
  Person *resizesPersonList;
  Admin *this_local;
  
  uVar2 = (ulong)(Innopolis->persons_count << 1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x60),0);
  if (SUB168(auVar1 * ZEXT816(0x60),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pPVar4 = (Person *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_48 = pPVar4;
    do {
      Person::Person(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != pPVar4 + uVar2);
  }
  for (local_28 = 0; local_28 < Innopolis->persons_count; local_28 = local_28 + 1) {
    Person::operator=(pPVar4 + local_28,Innopolis->persons + local_28);
  }
  Innopolis->persons_count = Innopolis->persons_count << 1;
  Innopolis->persons = pPVar4;
  return;
}

Assistant:

void resizePersons(){
        Person* resizesPersonList = new Person[Innopolis->persons_count*2];
        for(int i=0;i<Innopolis->persons_count;i++){
            resizesPersonList[i] = Innopolis->persons[i];
        }
        Innopolis->persons_count<<=1;
        Innopolis->persons = resizesPersonList;
    }